

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

int __thiscall
crnlib::dxt_image::get_block_endpoints
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *low_endpoint,
          color_quad_u8 *high_endpoint,bool scaled)

{
  uint16 packed_color5;
  uint uVar1;
  uint h;
  uint l;
  uint r;
  uint b;
  uint g;
  
  l = 0;
  h = 0;
  get_block_endpoints(this,block_x,block_y,element_index,&l,&h);
  packed_color5 = (uint16)l;
  switch(this->m_element_type[element_index]) {
  case cColorDXT1:
    dxt1_block::unpack_color(&r,&g,&b,(uint16)l,scaled);
    (low_endpoint->field_0).field_0.r = (uchar)r;
    (low_endpoint->field_0).field_0.g = (uchar)g;
    (low_endpoint->field_0).field_0.b = (uchar)b;
    dxt1_block::unpack_color(&r,&g,&b,(uint16)h,scaled);
    (high_endpoint->field_0).field_0.r = (uchar)r;
    (high_endpoint->field_0).field_0.g = (uchar)g;
    (high_endpoint->field_0).field_0.b = (uchar)b;
    break;
  case cAlphaDXT3:
  case cAlphaDXT5:
    uVar1 = (uint)this->m_element_component_index[element_index];
    (low_endpoint->field_0).c[uVar1] = (uchar)l;
    (high_endpoint->field_0).c[uVar1] = (uchar)h;
    return uVar1;
  case cColorETC1:
    if ((this->m_pElements
         [(block_y * this->m_blocks_x + block_x) * this->m_num_elements_per_block + element_index].
         m_bytes[3] & 2) == 0) {
      etc1_block::unpack_color4((etc1_block *)&r,(uint16)l,scaled,0xff);
      (low_endpoint->field_0).m_u32 = r;
      etc1_block::unpack_color4((etc1_block *)&r,(uint16)h,scaled,0xff);
      (high_endpoint->field_0).m_u32 = r;
    }
    else {
      etc1_block::unpack_color5((etc1_block *)&r,(uint16)l,scaled,0xff);
      (low_endpoint->field_0).m_u32 = r;
      etc1_block::unpack_color5(high_endpoint,packed_color5,(uint16)h,scaled,0xff);
    }
    break;
  default:
    return 0;
  }
  return -1;
}

Assistant:

int dxt_image::get_block_endpoints(uint block_x, uint block_y, uint element_index, color_quad_u8& low_endpoint, color_quad_u8& high_endpoint, bool scaled) const {
  uint l = 0, h = 0;
  get_block_endpoints(block_x, block_y, element_index, l, h);

  switch (m_element_type[element_index]) {
    case cColorETC1: {
      const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
      if (src_block.get_diff_bit()) {
        low_endpoint = etc1_block::unpack_color5(static_cast<uint16>(l), scaled);
        etc1_block::unpack_color5(high_endpoint, static_cast<uint16>(l), static_cast<uint16>(h), scaled);
      } else {
        low_endpoint = etc1_block::unpack_color4(static_cast<uint16>(l), scaled);
        high_endpoint = etc1_block::unpack_color4(static_cast<uint16>(h), scaled);
      }

      return -1;
    }
    case cColorDXT1: {
      uint r, g, b;

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(l), scaled);
      low_endpoint.r = static_cast<uint8>(r);
      low_endpoint.g = static_cast<uint8>(g);
      low_endpoint.b = static_cast<uint8>(b);

      dxt1_block::unpack_color(r, g, b, static_cast<uint16>(h), scaled);
      high_endpoint.r = static_cast<uint8>(r);
      high_endpoint.g = static_cast<uint8>(g);
      high_endpoint.b = static_cast<uint8>(b);

      return -1;
    }
    case cAlphaDXT5: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    case cAlphaDXT3: {
      const int component = m_element_component_index[element_index];

      low_endpoint[component] = static_cast<uint8>(l);
      high_endpoint[component] = static_cast<uint8>(h);

      return component;
    }
    default:
      break;
  }

  return 0;
}